

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O3

string * __thiscall
ast::CallExpression::toString_abi_cxx11_(string *__return_storage_ptr__,CallExpression *this)

{
  pointer ppEVar1;
  long lVar2;
  ostringstream msg;
  long local_1a0 [14];
  ios_base local_130 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  operator<<((ostream *)local_1a0,this->function);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"(",1);
  ppEVar1 = (this->arguments).super__Vector_base<ast::Expr_*,_std::allocator<ast::Expr_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->arguments).
                              super__Vector_base<ast::Expr_*,_std::allocator<ast::Expr_*>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)ppEVar1) >> 3)) {
    lVar2 = 0;
    do {
      if (lVar2 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,", ",2);
        ppEVar1 = (this->arguments).super__Vector_base<ast::Expr_*,_std::allocator<ast::Expr_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      }
      operator<<((ostream *)local_1a0,ppEVar1[lVar2]);
      lVar2 = lVar2 + 1;
      ppEVar1 = (this->arguments).super__Vector_base<ast::Expr_*,_std::allocator<ast::Expr_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (lVar2 < (int)((ulong)((long)(this->arguments).
                                         super__Vector_base<ast::Expr_*,_std::allocator<ast::Expr_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar1)
                          >> 3));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,")",1);
  std::ios::widen((char)(ostream *)local_1a0 + (char)*(undefined8 *)(local_1a0[0] + -0x18));
  std::ostream::put((char)local_1a0);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

std::string ast::CallExpression::toString() const
{
    std::ostringstream msg;
    msg << function;
    msg << "(";
    for(int i{0}; i < (int)arguments.size(); i++){
        if(i > 0 && i+1 <= (int)arguments.size()){
            msg << ", ";
        }
        msg << arguments[i];
    }
    msg << ")" << std::endl;
    return msg.str();
}